

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void __thiscall acto::core::runtime_t::deconstruct_object(runtime_t *this,object_t *obj)

{
  long *plVar1;
  waiter_t *pwVar2;
  bool bVar3;
  size_type sVar4;
  __int_type _Var5;
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> g_2;
  lock_guard<std::mutex> g_1;
  bool is_binded;
  waiter_t *next;
  waiter_t *it;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> g;
  object_t *obj_local;
  runtime_t *this_local;
  
  g._M_device = (mutex_type *)obj;
  if (obj != (object_t *)0x0) {
    std::lock_guard<std::mutex>::lock_guard(&local_20,&obj->cs);
    g._M_device[2].super___mutex_base._M_mutex.__size[0x10] =
         g._M_device[2].super___mutex_base._M_mutex.__size[0x10] & 0xfbU | 4;
    if (((byte)g._M_device[2].super___mutex_base._M_mutex.__size[0x10] >> 3 & 1) == 0) {
      if (*(long *)((long)&g._M_device[1].super___mutex_base._M_mutex + 8) != 0) {
        std::__atomic_base<unsigned_long>::operator++
                  ((__atomic_base<unsigned_long> *)(g._M_device + 2),0);
        plVar1 = *(long **)((long)&g._M_device[1].super___mutex_base._M_mutex + 8);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
        *(undefined8 *)((long)&g._M_device[1].super___mutex_base._M_mutex + 8) = 0;
        if (*(long *)((long)&g._M_device[2].super___mutex_base._M_mutex + 8) != 0) {
          next = *(waiter_t **)((long)&g._M_device[2].super___mutex_base._M_mutex + 8);
          while (next != (waiter_t *)0x0) {
            pwVar2 = (next->super_node<acto::core::object_t::waiter_t>).next;
            event::signaled(&next->on_deleted);
            next = pwVar2;
          }
          *(undefined8 *)((long)&g._M_device[2].super___mutex_base._M_mutex + 8) = 0;
        }
        std::__atomic_base<unsigned_long>::operator--
                  ((__atomic_base<unsigned_long> *)(g._M_device + 2),0);
      }
      if (*(long *)((long)&g._M_device[1].super___mutex_base._M_mutex + 0x10) != 0) {
        std::__atomic_base<unsigned_long>::operator--
                  (&(this->workers_).reserved.super___atomic_base<unsigned_long>);
        worker_t::wakeup(*(worker_t **)((long)&g._M_device[1].super___mutex_base._M_mutex + 0x10));
        *(undefined8 *)((long)&g._M_device[1].super___mutex_base._M_mutex + 0x10) = 0;
      }
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
    if (!bVar3) {
      if ((g._M_device[2].super___mutex_base._M_mutex.__size[0x10] & 1U) == 0) {
        std::lock_guard<std::mutex>::lock_guard(&g_2,&this->mutex_);
        sVar4 = std::
                unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
                ::erase(&this->actors_,(key_type *)&g);
        if ((sVar4 != 0) &&
           (bVar3 = std::
                    unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
                    ::empty(&this->actors_), bVar3)) {
          event::signaled(&this->no_actors_event_);
        }
        std::lock_guard<std::mutex>::~lock_guard(&g_2);
      }
      std::lock_guard<std::mutex>::lock_guard
                (&local_58,(mutex_type *)((long)&((g._M_device)->super___mutex_base)._M_mutex + 8));
      _Var5 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)(g._M_device + 2))
      ;
      std::lock_guard<std::mutex>::~lock_guard(&local_58);
      if ((_Var5 == 0) && (g._M_device != (mutex_type *)0x0)) {
        operator_delete(g._M_device,0x68);
      }
    }
    return;
  }
  __assert_fail("obj",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                ,0x78,"void acto::core::runtime_t::deconstruct_object(object_t *const)");
}

Assistant:

void runtime_t::deconstruct_object(object_t* const obj) {
  assert(obj);

  {
    std::lock_guard<std::mutex> g(obj->cs);

    obj->deleting = true;
    // The object still has some messages in the mailbox.
    if (obj->scheduled) {
      return;
    }
    //
    if (obj->impl) {
      // Take temporary reference to the object to avoid calling the decontruct
      // function during deleteing the object's body.
      obj->references++;

      delete obj->impl, obj->impl = nullptr;

      if (obj->waiters) {
        for (object_t::waiter_t* it = obj->waiters; it != nullptr;) {
          // Make the event signaled will lead to destruction of the list node.
          // So retrieve pointer to the next node beforehand.
          object_t::waiter_t* next = it->next;
          it->on_deleted.signaled();
          it = next;
        }

        obj->waiters = nullptr;
      }

      obj->references--;
    }
    // The didicated thread will place itself into shared pool.
    if (obj->thread) {
      --workers_.reserved;
      obj->thread->wakeup();
      obj->thread = nullptr;
    }
  }

  const bool is_binded = obj->binded;

  // Remove object from the global registry.
  if (!is_binded) {
    std::lock_guard<std::mutex> g(mutex_);

    if (actors_.erase(obj)) {
      if (actors_.empty()) {
        no_actors_event_.signaled();
      }
    }
  }

  {
    std::lock_guard g(obj->cs);
    // Cannot delete the object if there are still some references to it.
    if (obj->references) {
      return;
    }
  }

  // There are no more references to the object,
  // so delete it.
  delete obj;
}